

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodetxb.c
# Opt level: O0

void read_coeffs_reverse(aom_reader *r,TX_SIZE tx_size,TX_CLASS tx_class,int start_si,int end_si,
                        int16_t *scan,int bhl,uint8_t *levels,base_cdf_arr base_cdf,
                        br_cdf_arr br_cdf)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  aom_reader *in_stack_00000010;
  int k;
  int idx;
  aom_cdf_prob *cdf;
  int br_ctx;
  int level;
  int nsymbs;
  int coeff_ctx;
  int pos;
  int c;
  int stats;
  int mag_1;
  int pos_1;
  int stride;
  int row_1;
  int col_2;
  int mag;
  int row;
  int col_1;
  int col;
  int ctx;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  aom_reader *in_stack_ffffffffffffff10;
  int local_c4;
  int local_b4;
  int local_a4;
  
  local_a4 = in_R8D;
  do {
    if (local_a4 < in_ECX) {
      return;
    }
    iVar1 = (int)*(short *)(in_R9 + (long)local_a4 * 2);
    get_padded_idx(iVar1,in_stack_00000008);
    local_b4 = aom_read_symbol_(in_stack_ffffffffffffff10,
                                (aom_cdf_prob *)
                                CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),0);
    if (2 < local_b4) {
      for (local_c4 = 0; local_c4 < 0xc; local_c4 = local_c4 + 3) {
        iVar2 = aom_read_symbol_(in_stack_ffffffffffffff10,
                                 (aom_cdf_prob *)
                                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),0);
        local_b4 = iVar2 + local_b4;
        if (iVar2 < 3) break;
      }
    }
    in_stack_ffffffffffffff0f = (undefined1)local_b4;
    in_stack_ffffffffffffff10 = in_stack_00000010;
    iVar1 = get_padded_idx(iVar1,in_stack_00000008);
    *(undefined1 *)((long)&in_stack_ffffffffffffff10->buffer + (long)iVar1) =
         in_stack_ffffffffffffff0f;
    local_a4 = local_a4 + -1;
  } while( true );
}

Assistant:

static inline void read_coeffs_reverse(aom_reader *r, TX_SIZE tx_size,
                                       TX_CLASS tx_class, int start_si,
                                       int end_si, const int16_t *scan, int bhl,
                                       uint8_t *levels, base_cdf_arr base_cdf,
                                       br_cdf_arr br_cdf) {
  for (int c = end_si; c >= start_si; --c) {
    const int pos = scan[c];
    const int coeff_ctx =
        get_lower_levels_ctx(levels, pos, bhl, tx_size, tx_class);
    const int nsymbs = 4;
    int level = aom_read_symbol(r, base_cdf[coeff_ctx], nsymbs, ACCT_STR);
    if (level > NUM_BASE_LEVELS) {
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf = br_cdf[br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = aom_read_symbol(r, cdf, BR_CDF_SIZE, ACCT_STR);
        level += k;
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
    levels[get_padded_idx(pos, bhl)] = level;
  }
}